

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

string * __thiscall Query::as_string_repr_abi_cxx11_(Query *this)

{
  bool bVar1;
  reference this_00;
  uint64_t uVar2;
  const_reference pvVar3;
  long in_RSI;
  string *in_RDI;
  QToken *token;
  const_iterator __end1;
  const_iterator __begin1;
  QString *__range1;
  string out;
  vector<QToken,_std::allocator<QToken>_> *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  string *this_01;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  __normal_iterator<const_QToken_*,_std::vector<QToken,_std::allocator<QToken>_>_>
  in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  allocator<char> local_31;
  string local_30 [48];
  
  this_01 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa0._M_current,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90);
  std::allocator<char>::~allocator(&local_31);
  bVar1 = std::vector<QToken,_std::allocator<QToken>_>::empty
                    ((vector<QToken,_std::allocator<QToken>_> *)this_01);
  if (bVar1) {
    ::fmt::v6::format<char[10],int,unsigned_int_const&,char>
              ((char (*) [10])CONCAT44(in_stack_ffffffffffffffbc,*(undefined4 *)(in_RSI + 0x20)),
               (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  else {
    std::vector<QToken,_std::allocator<QToken>_>::begin(in_stack_ffffffffffffff58);
    std::vector<QToken,_std::allocator<QToken>_>::end(in_stack_ffffffffffffff58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_QToken_*,_std::vector<QToken,_std::allocator<QToken>_>_>
                          *)in_stack_ffffffffffffff60,
                         (__normal_iterator<const_QToken_*,_std::vector<QToken,_std::allocator<QToken>_>_>
                          *)in_stack_ffffffffffffff58);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_QToken_*,_std::vector<QToken,_std::allocator<QToken>_>_>::
                operator*((__normal_iterator<const_QToken_*,_std::vector<QToken,_std::allocator<QToken>_>_>
                           *)&stack0xffffffffffffffa0);
      uVar2 = QToken::num_possible_values((QToken *)0x1c59c2);
      if (uVar2 == 1) {
        in_stack_ffffffffffffff60 = QToken::possible_values(this_00);
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (in_stack_ffffffffffffff60,0);
        std::__cxx11::string::operator+=(local_30,*pvVar3);
      }
      else {
        std::__cxx11::string::operator+=(local_30,"?");
      }
      __gnu_cxx::__normal_iterator<const_QToken_*,_std::vector<QToken,_std::allocator<QToken>_>_>::
      operator++((__normal_iterator<const_QToken_*,_std::vector<QToken,_std::allocator<QToken>_>_> *
                 )&stack0xffffffffffffffa0);
    }
    std::__cxx11::string::string((string *)this_01,local_30);
  }
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string Query::as_string_repr() const {
    std::string out = "";
    if (value.empty()) {
        // Query is already after planning stage. Show low-level representation.
        // First digit is the index type and the rest is the raw trigram.
        // Underscore was picked to make copying from terminal easier.
        return fmt::format("{}_{:06x}", (int)ngram.itype, ngram.trigram);
    }
    // No query plan yet. Show stringlike representation.
    for (const auto &token : value) {
        if (token.num_possible_values() == 1) {
            out += token.possible_values()[0];
        } else {
            out += "?";
        }
    }
    return out;
}